

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
          (cmFileListGeneratorMacProject *this,cmFileListGeneratorMacProject *r)

{
  pointer pcVar1;
  
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorMacProject_005c4f00;
  this->Names = r->Names;
  (this->Extension)._M_dataplus._M_p = (pointer)&(this->Extension).field_2;
  pcVar1 = (r->Extension)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Extension,pcVar1,pcVar1 + (r->Extension)._M_string_length);
  return;
}

Assistant:

cmFileListGeneratorMacProject(cmFileListGeneratorMacProject const& r):
    cmFileListGeneratorBase(), Names(r.Names), Extension(r.Extension) {}